

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_do_more(connectdata *conn,int *completep)

{
  Curl_easy *data;
  void *pvVar1;
  Curl_easy *pCVar2;
  char *pcVar3;
  CURLcode CVar4;
  uint remote_port;
  ushort **ppuVar5;
  long lVar6;
  long lVar7;
  ftpstate newstate;
  byte bVar8;
  char *proxy_name;
  _Bool _Var9;
  byte *__nptr;
  _Bool connected;
  char *ptr2;
  _Bool serv_conned;
  _Bool local_d9;
  uint *local_d8;
  long local_d0;
  void *local_c8;
  byte *local_c0;
  byte *local_b8 [17];
  
  data = conn->data;
  local_d9 = false;
  pvVar1 = (data->req).protop;
  CVar4 = CURLE_OK;
  local_d8 = (uint *)completep;
  if ((conn->bits).tcpconnect[1] != false) goto LAB_0011c2af;
  if (conn->tunnel_state[1] == TUNNEL_CONNECT) {
    CVar4 = Curl_proxyCONNECT(conn,1,(char *)0x0,0,false);
    return CVar4;
  }
  CVar4 = Curl_is_connected(conn,1,&local_d9);
  if (local_d9 != true) {
    if (CVar4 == CURLE_OK) {
      return CURLE_OK;
    }
    if ((conn->proto).ftpc.count1 != 0) {
      return CVar4;
    }
    *local_d8 = 0xffffffff;
    CVar4 = ftp_epsv_disable(conn);
    return CVar4;
  }
  if ((conn->bits).proxy != true) goto LAB_0011c2af;
  CVar4 = CURLE_OK;
  Curl_infof(data,"Connection to proxy confirmed\n");
  pcVar3 = (conn->proto).ftpc.newhost;
  remote_port = (uint)(conn->proto).ftpc.newport;
  local_d0 = CONCAT44(local_d0._4_4_,remote_port);
  pCVar2 = conn->data;
  local_d9 = false;
  switch(conn->proxytype) {
  case CURLPROXY_HTTP:
  case CURLPROXY_HTTP_1_0:
    break;
  default:
    Curl_failf(pCVar2,"unknown proxytype option given");
    CVar4 = CURLE_COULDNT_CONNECT;
    break;
  case CURLPROXY_SOCKS4:
    proxy_name = conn->proxyuser;
    _Var9 = false;
    goto LAB_0011c6d0;
  case CURLPROXY_SOCKS5:
  case CURLPROXY_SOCKS5_HOSTNAME:
    CVar4 = Curl_SOCKS5(conn->proxyuser,conn->proxypasswd,pcVar3,remote_port,1,conn);
    goto LAB_0011c6d5;
  case CURLPROXY_SOCKS4A:
    proxy_name = conn->proxyuser;
    _Var9 = true;
LAB_0011c6d0:
    CVar4 = Curl_SOCKS4(proxy_name,pcVar3,remote_port,1,conn,_Var9);
LAB_0011c6d5:
    local_d9 = true;
  }
  if (((conn->bits).tunnel_proxy == true) && ((conn->bits).httpproxy == true)) {
    local_c8 = (pCVar2->req).protop;
    memset(local_b8,0,0x88);
    (pCVar2->req).protop = local_b8;
    CVar4 = Curl_proxyCONNECT(conn,1,pcVar3,(int)local_d0,true);
    (pCVar2->req).protop = local_c8;
    if (CVar4 == CURLE_OK) {
      if (conn->tunnel_state[1] == TUNNEL_COMPLETE) {
        local_d9 = true;
      }
      else {
        (conn->proto).ftpc.state = FTP_STOP;
      }
    }
  }
LAB_0011c2af:
  if ((conn->proto).ftpc.state != FTP_STOP) {
    CVar4 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
    *local_d8 = (uint)((conn->proto).ftpc.state == FTP_STOP);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    _Var9 = (conn->proto).ftpc.wait_data_conn;
    if (_Var9 == false) {
      return CURLE_OK;
    }
    CVar4 = CURLE_OK;
    if (_Var9 != false) {
      *local_d8 = 0;
    }
  }
  if (1 < *(uint *)((long)pvVar1 + 0x18)) {
    if (CVar4 == CURLE_OK) {
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
    }
    if ((conn->proto).ftpc.wait_data_conn != false) {
      return CVar4;
    }
    *local_d8 = 1;
    return CVar4;
  }
  if ((conn->proto).ftpc.wait_data_conn == true) {
    CVar4 = ReceivedServerConnect(conn,(_Bool *)local_b8);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if ((char)local_b8[0] != '\x01') {
      return CURLE_OK;
    }
    CVar4 = AcceptServerConnect(conn);
    (conn->proto).ftpc.wait_data_conn = false;
    if (CVar4 == CURLE_OK) {
      CVar4 = InitiateTransfer(conn);
    }
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    *local_d8 = 1;
    return CURLE_OK;
  }
  if ((data->set).upload == true) {
    CVar4 = ftp_nb_type(conn,(data->set).prefer_ascii,FTP_STOR_TYPE);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
    if ((conn->proto).ftpc.wait_data_conn == true) {
      *local_d8 = 0;
      return CVar4;
    }
    goto LAB_0011c659;
  }
  *(undefined8 *)((long)pvVar1 + 0x20) = 0xffffffffffffffff;
  pCVar2 = conn->data;
  if (((pCVar2->state).use_range == true) && (pcVar3 = (pCVar2->state).range, pcVar3 != (char *)0x0)
     ) {
    local_d0 = strtol(pcVar3,(char **)local_b8,0);
    bVar8 = *local_b8[0];
    __nptr = local_b8[0];
    if (bVar8 != 0) {
      ppuVar5 = __ctype_b_loc();
      do {
        if ((bVar8 != 0x2d) && (((*ppuVar5)[bVar8] & 0x2000) == 0)) break;
        bVar8 = __nptr[1];
        __nptr = __nptr + 1;
      } while (bVar8 != 0);
    }
    local_b8[0] = __nptr;
    lVar6 = strtol((char *)__nptr,(char **)&local_c0,0);
    lVar7 = -1;
    if (__nptr != local_c0) {
      lVar7 = lVar6;
    }
    if (lVar7 != -1 || local_d0 < 0) {
      lVar7 = (lVar7 - local_d0) + 1;
      if (local_d0 < 0) {
        lVar7 = -local_d0;
      }
      (pCVar2->req).maxdownload = lVar7;
    }
    (pCVar2->state).resume_from = local_d0;
    (conn->proto).ftpc.dont_check = true;
  }
  else {
    (pCVar2->req).maxdownload = -1;
  }
  if (((data->set).ftp_list_only == false) && ((conn->proto).ftpc.file != (char *)0x0)) {
    _Var9 = (data->set).prefer_ascii;
    newstate = FTP_RETR_TYPE;
LAB_0011c63c:
    CVar4 = ftp_nb_type(conn,_Var9,newstate);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
  else if (*(int *)((long)pvVar1 + 0x18) == 0) {
    _Var9 = true;
    newstate = FTP_LIST_TYPE;
    goto LAB_0011c63c;
  }
  CVar4 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
LAB_0011c659:
  *local_d8 = (uint)((conn->proto).ftpc.state == FTP_STOP);
  return CVar4;
}

Assistant:

static CURLcode ftp_do_more(struct connectdata *conn, int *completep)
{
  struct Curl_easy *data=conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  bool complete = FALSE;

  /* the ftp struct is inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;

  /* if the second connection isn't done yet, wait for it */
  if(!conn->bits.tcpconnect[SECONDARYSOCKET]) {
    if(conn->tunnel_state[SECONDARYSOCKET] == TUNNEL_CONNECT) {
      /* As we're in TUNNEL_CONNECT state now, we know the proxy name and port
         aren't used so we blank their arguments. TODO: make this nicer */
      result = Curl_proxyCONNECT(conn, SECONDARYSOCKET, NULL, 0, FALSE);

      return result;
    }

    result = Curl_is_connected(conn, SECONDARYSOCKET, &connected);

    /* Ready to do more? */
    if(connected) {
      DEBUGF(infof(data, "DO-MORE connected phase starts\n"));
      if(conn->bits.proxy) {
        infof(data, "Connection to proxy confirmed\n");
        result = proxy_magic(conn, ftpc->newhost, ftpc->newport, &connected);
      }
    }
    else {
      if(result && (ftpc->count1 == 0)) {
        *completep = -1; /* go back to DOING please */
        /* this is a EPSV connect failing, try PASV instead */
        return ftp_epsv_disable(conn);
      }
      return result;
    }
  }

  if(ftpc->state) {
    /* already in a state so skip the intial commands.
       They are only done to kickstart the do_more state */
    result = ftp_multi_statemach(conn, &complete);

    *completep = (int)complete;

    /* if we got an error or if we don't wait for a data connection return
       immediately */
    if(result || (ftpc->wait_data_conn != TRUE))
      return result;

    if(ftpc->wait_data_conn)
      /* if we reach the end of the FTP state machine here, *complete will be
         TRUE but so is ftpc->wait_data_conn, which says we need to wait for
         the data connection and therefore we're not actually complete */
      *completep = 0;
  }

  if(ftp->transfer <= FTPTRANSFER_INFO) {
    /* a transfer is about to take place, or if not a file name was given
       so we'll do a SIZE on it later and then we need the right TYPE first */

    if(ftpc->wait_data_conn == TRUE) {
      bool serv_conned;

      result = ReceivedServerConnect(conn, &serv_conned);
      if(result)
        return result; /* Failed to accept data connection */

      if(serv_conned) {
        /* It looks data connection is established */
        result = AcceptServerConnect(conn);
        ftpc->wait_data_conn = FALSE;
        if(!result)
          result = InitiateTransfer(conn);

        if(result)
          return result;

        *completep = 1; /* this state is now complete when the server has
                           connected back to us */
      }
    }
    else if(data->set.upload) {
      result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_STOR_TYPE);
      if(result)
        return result;

      result = ftp_multi_statemach(conn, &complete);
      if(ftpc->wait_data_conn)
        /* if we reach the end of the FTP state machine here, *complete will be
           TRUE but so is ftpc->wait_data_conn, which says we need to wait for
           the data connection and therefore we're not actually complete */
        *completep = 0;
      else
        *completep = (int)complete;
    }
    else {
      /* download */
      ftp->downloadsize = -1; /* unknown as of yet */

      result = ftp_range(conn);
      if(result)
        ;
      else if(data->set.ftp_list_only || !ftpc->file) {
        /* The specified path ends with a slash, and therefore we think this
           is a directory that is requested, use LIST. But before that we
           need to set ASCII transfer mode. */

        /* But only if a body transfer was requested. */
        if(ftp->transfer == FTPTRANSFER_BODY) {
          result = ftp_nb_type(conn, TRUE, FTP_LIST_TYPE);
          if(result)
            return result;
        }
        /* otherwise just fall through */
      }
      else {
        result = ftp_nb_type(conn, data->set.prefer_ascii, FTP_RETR_TYPE);
        if(result)
          return result;
      }

      result = ftp_multi_statemach(conn, &complete);
      *completep = (int)complete;
    }
    return result;
  }

  if(!result && (ftp->transfer != FTPTRANSFER_BODY))
    /* no data to transfer. FIX: it feels like a kludge to have this here
       too! */
    Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

  if(!ftpc->wait_data_conn) {
    /* no waiting for the data connection so this is now complete */
    *completep = 1;
    DEBUGF(infof(data, "DO-MORE phase ends with %d\n", (int)result));
  }

  return result;
}